

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bob.cpp
# Opt level: O1

void __thiscall Bob::UpdateAlphas(Bob *this)

{
  pointer plVar1;
  pointer pvVar2;
  pointer plVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  lVar8 = (long)(this->super_Party).n_p;
  if (0 < lVar8) {
    plVar1 = (this->super_Party).AlphaRandoms.super__Vector_base<long,_std::allocator<long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (this->super_Party).P.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar3 = (this->super_Party).AlphaRandoms.super__Vector_base<long,_std::allocator<long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar9 = (ulong)(uint)(this->super_Party).alpha_rc;
    lVar10 = 0;
    do {
      *(long *)(*(long *)((long)&(pvVar2->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                 super__Vector_impl_data + lVar10) + 0x20) = plVar1[(int)uVar9];
      auVar4._8_4_ = 0;
      auVar4._0_8_ = (long)plVar3 - (long)plVar1 >> 3;
      auVar6._8_4_ = 0;
      auVar6._0_8_ = (long)((int)uVar9 + 1);
      uVar9 = SUB128(auVar6 % auVar4,0);
      lVar10 = lVar10 + 0x18;
    } while (lVar8 * 0x18 != lVar10);
    (this->super_Party).alpha_rc = SUB124(auVar6 % auVar4,0);
  }
  lVar8 = (long)(this->super_Party).n_d;
  if (0 < lVar8) {
    plVar1 = (this->super_Party).AlphaRandoms.super__Vector_base<long,_std::allocator<long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (this->super_Party).D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar3 = (this->super_Party).AlphaRandoms.super__Vector_base<long,_std::allocator<long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar9 = (ulong)(uint)(this->super_Party).alpha_rc;
    lVar10 = 0;
    do {
      *(long *)(*(long *)((long)&(pvVar2->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                 super__Vector_impl_data + lVar10) + 8) = plVar1[(int)uVar9];
      auVar5._8_4_ = 0;
      auVar5._0_8_ = (long)plVar3 - (long)plVar1 >> 3;
      auVar7._8_4_ = 0;
      auVar7._0_8_ = (long)((int)uVar9 + 1);
      uVar9 = SUB128(auVar7 % auVar5,0);
      lVar10 = lVar10 + 0x18;
    } while (lVar8 * 0x18 != lVar10);
    (this->super_Party).alpha_rc = SUB124(auVar7 % auVar5,0);
  }
  return;
}

Assistant:

void Bob::UpdateAlphas()
{
    for(int i = 0; i < n_p; i++)
    {
        P[i][4] = AlphaRandoms[alpha_rc++];
        alpha_rc = alpha_rc % AlphaRandoms.size();
    }    
    for(int i = 0; i < n_d; i++)
    {
        D[i][1] = AlphaRandoms[alpha_rc++];
        alpha_rc = alpha_rc % AlphaRandoms.size();
    }   
}